

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  size_type sVar1;
  SQObjectPtr *o;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  SQUnsignedInteger n;
  SQUnsignedInteger nvalues;
  SQSharedState *in_stack_ffffffffffffff58;
  SQInstance *in_stack_ffffffffffffff60;
  undefined8 *local_48;
  ulong local_40;
  
  SQDelegable::SQDelegable(&in_stack_ffffffffffffff60->super_SQDelegable);
  *in_RDI = &PTR__SQInstance_0021be60;
  local_48 = in_RDI + 0xc;
  do {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
    local_48 = local_48 + 2;
  } while (local_48 != in_RDI + 0xe);
  in_RDI[0xb] = in_RCX;
  in_RDI[7] = in_RDX;
  sVar1 = sqvector<SQClassMember,_unsigned_int>::size
                    ((sqvector<SQClassMember,_unsigned_int> *)(in_RDI[7] + 0x40));
  for (local_40 = 0; local_40 < sVar1; local_40 = local_40 + 1) {
    o = &sqvector<SQClassMember,_unsigned_int>::operator[]
                   ((sqvector<SQClassMember,_unsigned_int> *)(in_RDI[7] + 0x40),(size_type)local_40)
         ->val;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + local_40 * 2 + 0xc),o);
  }
  Init(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}